

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t gt_tval_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,int timeridx)

{
  int iVar1;
  uint64_t uVar3;
  uint64_t uVar2;
  
  if (((int)ri == 4) || ((int)ri == 1)) {
    uVar2 = gt_virt_cnt_offset(env);
    iVar1 = (int)uVar2;
  }
  else {
    iVar1 = 0;
  }
  uVar2 = (env->cp15).c14_timer[(ulong)ri & 0xffffffff].cval;
  uVar3 = gt_get_countervalue(env);
  return (ulong)(uint)((iVar1 + (int)uVar2) - (int)uVar3);
}

Assistant:

static uint64_t gt_tval_read(CPUARMState *env, const ARMCPRegInfo *ri,
                             int timeridx)
{
    uint64_t offset = 0;

    switch (timeridx) {
    case GTIMER_VIRT:
    case GTIMER_HYPVIRT:
        offset = gt_virt_cnt_offset(env);
        break;
    }

    return (uint32_t)(env->cp15.c14_timer[timeridx].cval -
                      (gt_get_countervalue(env) - offset));
}